

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSD.cpp
# Opt level: O0

float getDistance(Mat *v1,Mat *v2)

{
  double dVar1;
  double *pdVar2;
  float fVar3;
  _InputArray local_258;
  Vec<double,_4> local_240;
  double local_220;
  double sum;
  _InputArray local_200;
  Mat local_1d8 [352];
  MatExpr local_78 [8];
  Mat sub;
  Mat *v2_local;
  Mat *v1_local;
  
  cv::operator-(local_1d8,v1);
  cv::MatExpr::operator_cast_to_Mat(local_78);
  cv::MatExpr::~MatExpr((MatExpr *)local_1d8);
  cv::_InputArray::_InputArray(&local_200,(Mat *)local_78);
  cv::_OutputArray::_OutputArray((_OutputArray *)&sum,(Mat *)local_78);
  cv::pow(&local_200,2.0,(_OutputArray *)&sum);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&sum);
  cv::_InputArray::~_InputArray(&local_200);
  cv::_InputArray::_InputArray(&local_258,(Mat *)local_78);
  cv::sum((_InputArray *)&local_240);
  pdVar2 = cv::Vec<double,_4>::operator[](&local_240,0);
  dVar1 = *pdVar2;
  cv::_InputArray::~_InputArray(&local_258);
  local_220 = dVar1;
  fVar3 = sqrtf((float)dVar1);
  cv::Mat::~Mat((Mat *)local_78);
  return fVar3;
}

Assistant:

float getDistance(Mat& v1, Mat& v2) {
	Mat sub = v1 - v2;
	pow(sub, 2.0, sub);
	double sum=cv::sum(sub)[0];
	return sqrtf(sum);
}